

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscReaderGeneric::GetDeferredDeltaCommon
          (SscReaderGeneric *this,VariableBase *variable,void *data)

{
  bool bVar1;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long *d;
  iterator __end3;
  iterator __begin3;
  Dims *__range3;
  value_type *b;
  Dims vMemCount;
  Dims vMemStart;
  Dims vShape;
  Dims vCount;
  Dims vStart;
  allocator *in_stack_fffffffffffffdf8;
  allocator *in_stack_fffffffffffffe00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe08;
  allocator *paVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  allocator local_189;
  string local_188 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea0;
  allocator local_139;
  string local_138 [32];
  reference local_118;
  unsigned_long *local_110;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  Dims *local_100;
  reference local_f8;
  unsigned_long *local_f0;
  unsigned_long *local_e8;
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  void *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe48);
  if (*(int *)(*(long *)(in_RDI + 0xc0) + 0x58) != 0) {
    local_a8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    local_b0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_b8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    local_c0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_c8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    local_d0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_d8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    local_e0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_e8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    local_f0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf8);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  std::
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  ::emplace_back<>((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                    *)in_stack_fffffffffffffe00);
  local_f8 = std::
             vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
             ::back((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                     *)in_stack_fffffffffffffe00);
  std::__cxx11::string::operator=((string *)local_f8,(string *)(local_10 + 8));
  local_f8->type = *(DataType *)(local_10 + 0x28);
  local_f8->elementSize = *(size_t *)(local_10 + 0x30);
  local_f8->shapeId = *(ShapeID *)(local_10 + 0x40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_f8->bufferStart = 0;
  local_f8->bufferCount = 0;
  local_f8->data = local_18;
  local_f8->performed = false;
  local_100 = &local_f8->count;
  local_108._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdf8
                 );
  local_110 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    local_118 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_108);
    if (*local_118 == 0) {
      in_stack_fffffffffffffe10._M_current = (unsigned_long *)&local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_138,"Engine",(allocator *)in_stack_fffffffffffffe10._M_current);
      paVar2 = (allocator *)&stack0xfffffffffffffe9f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffea0,"SscReader",paVar2);
      in_stack_fffffffffffffe00 = &local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"GetDeferredDeltaCommon",in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdf8 = (allocator *)&stack0xfffffffffffffe4f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe50,"SetSelection count dimensions cannot be 0",
                 in_stack_fffffffffffffdf8);
      helper::Throw<std::invalid_argument>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4f);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe9f);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_108);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe10._M_current);
  return;
}

Assistant:

void SscReaderGeneric::GetDeferredDeltaCommon(VariableBase &variable, void *data)
{

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;
    Dims vMemStart = variable.m_MemoryStart;
    Dims vMemCount = variable.m_MemoryCount;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    m_LocalReadPattern.emplace_back();
    auto &b = m_LocalReadPattern.back();
    b.name = variable.m_Name;
    b.type = variable.m_Type;
    b.elementSize = variable.m_ElementSize;
    b.shapeId = variable.m_ShapeID;
    b.start = vStart;
    b.count = vCount;
    b.shape = vShape;
    b.memStart = vMemStart;
    b.memCount = vMemCount;
    b.bufferStart = 0;
    b.bufferCount = 0;
    b.data = data;
    b.performed = false;

    for (const auto &d : b.count)
    {
        if (d == 0)
        {
            helper::Throw<std::invalid_argument>("Engine", "SscReader", "GetDeferredDeltaCommon",
                                                 "SetSelection count dimensions cannot be 0");
        }
    }
}